

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O2

QAbstractItemModel * createListModel(QObject *parent)

{
  QStringListModel *this;
  QArrayDataPointer<QString> local_148;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  QArrayDataPointer<char16_t> local_28;
  
  this = (QStringListModel *)operator_new(0x28);
  local_148.size = 0;
  local_28.d = (Data *)0x0;
  local_148.d = (Data *)0x0;
  local_148.ptr = (QString *)0x0;
  local_28.ptr = L"1";
  local_28.size = 1;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  local_a8.size = 0;
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_148,(QString *)&local_28);
  local_40.d = (Data *)0x0;
  local_40.ptr = L"2";
  local_40.size = 1;
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (char16_t *)0x0;
  local_c8.size = 0;
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_148,(QString *)&local_40);
  local_58.d = (Data *)0x0;
  local_58.ptr = L"3";
  local_58.size = 1;
  local_e8.d = (Data *)0x0;
  local_e8.ptr = (char16_t *)0x0;
  local_e8.size = 0;
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_148,(QString *)&local_58);
  local_70.d = (Data *)0x0;
  local_70.ptr = L"4";
  local_70.size = 1;
  local_108.d = (Data *)0x0;
  local_108.ptr = (char16_t *)0x0;
  local_108.size = 0;
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_148,(QString *)&local_70);
  local_88.d = (Data *)0x0;
  local_88.ptr = L"5";
  local_88.size = 1;
  local_128.d = (Data *)0x0;
  local_128.ptr = (char16_t *)0x0;
  local_128.size = 0;
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_148,(QString *)&local_88);
  QStringListModel::QStringListModel(this,(QList *)&local_148,parent);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_148);
  return (QAbstractItemModel *)this;
}

Assistant:

QAbstractItemModel *createListModel(QObject *parent)
{
    return new QStringListModel(
            QStringList() << QStringLiteral("1") << QStringLiteral("2") << QStringLiteral("3") << QStringLiteral("4") << QStringLiteral("5"), parent);
}